

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# palette.c
# Opt level: O0

int av1_index_color_cache
              (uint16_t *color_cache,int n_cache,uint16_t *colors,int n_colors,
              uint8_t *cache_color_found,int *out_cache_colors)

{
  int in_ECX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  void *in_R8;
  long in_R9;
  int i_2;
  int j;
  int j_1;
  int i_1;
  int in_cache_flags [8];
  int n_in_cache;
  int i;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  int local_68 [10];
  int local_40;
  int local_3c;
  long local_38;
  void *local_30;
  int local_24;
  long local_20;
  int local_14;
  long local_10;
  int local_4;
  
  if (in_ESI < 1) {
    for (local_3c = 0; local_4 = in_ECX, local_3c < in_ECX; local_3c = local_3c + 1) {
      *(uint *)(in_R9 + (long)local_3c * 4) = (uint)*(ushort *)(in_RDX + (long)local_3c * 2);
    }
  }
  else {
    local_38 = in_R9;
    local_30 = in_R8;
    local_24 = in_ECX;
    local_20 = in_RDX;
    local_14 = in_ESI;
    local_10 = in_RDI;
    memset(in_R8,0,(long)in_ESI);
    local_40 = 0;
    memset(local_68,0,0x20);
    for (local_6c = 0; local_6c < local_14 && local_40 < local_24; local_6c = local_6c + 1) {
      for (local_70 = 0; local_70 < local_24; local_70 = local_70 + 1) {
        if (*(short *)(local_20 + (long)local_70 * 2) == *(short *)(local_10 + (long)local_6c * 2))
        {
          local_68[local_70] = 1;
          *(undefined1 *)((long)local_30 + (long)local_6c) = 1;
          local_40 = local_40 + 1;
          break;
        }
      }
    }
    local_74 = 0;
    for (local_78 = 0; local_78 < local_24; local_78 = local_78 + 1) {
      if (local_68[local_78] == 0) {
        *(uint *)(local_38 + (long)local_74 * 4) = (uint)*(ushort *)(local_20 + (long)local_78 * 2);
        local_74 = local_74 + 1;
      }
    }
    local_4 = local_74;
  }
  return local_4;
}

Assistant:

int av1_index_color_cache(const uint16_t *color_cache, int n_cache,
                          const uint16_t *colors, int n_colors,
                          uint8_t *cache_color_found, int *out_cache_colors) {
  if (n_cache <= 0) {
    for (int i = 0; i < n_colors; ++i) out_cache_colors[i] = colors[i];
    return n_colors;
  }
  memset(cache_color_found, 0, n_cache * sizeof(*cache_color_found));
  int n_in_cache = 0;
  int in_cache_flags[PALETTE_MAX_SIZE];
  memset(in_cache_flags, 0, sizeof(in_cache_flags));
  for (int i = 0; i < n_cache && n_in_cache < n_colors; ++i) {
    for (int j = 0; j < n_colors; ++j) {
      if (colors[j] == color_cache[i]) {
        in_cache_flags[j] = 1;
        cache_color_found[i] = 1;
        ++n_in_cache;
        break;
      }
    }
  }
  int j = 0;
  for (int i = 0; i < n_colors; ++i)
    if (!in_cache_flags[i]) out_cache_colors[j++] = colors[i];
  assert(j == n_colors - n_in_cache);
  return j;
}